

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void iadst4x4_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  int in_ECX;
  int in_EDX;
  __m128i *in_RSI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  int in_R9D;
  long lVar51;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  long lVar52;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar61;
  ulong uVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong uVar63;
  ulong uVar64;
  undefined1 auVar60 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i u3_high;
  __m128i u2_high;
  __m128i u1_high;
  __m128i u0_high;
  __m128i u3_low;
  __m128i u2_low;
  __m128i u1_low;
  __m128i u0_low;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i s7;
  __m128i s6;
  __m128i s5;
  __m128i s4;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m128i t;
  __m128i sinpi4;
  __m128i sinpi3;
  __m128i sinpi2;
  __m128i sinpi1;
  __m128i mul;
  __m128i rnding;
  __m128i zero;
  int32_t *sinpi;
  int local_97c;
  longlong local_978;
  longlong lStack_970;
  longlong local_968;
  longlong lStack_960;
  int local_94c;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  int local_848;
  int iStack_844;
  int iStack_840;
  int iStack_83c;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  int local_7c8;
  int iStack_7c4;
  int iStack_7c0;
  int iStack_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  ulong local_768;
  ulong uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  int32_t *local_740;
  int local_738;
  int local_734;
  int local_730;
  int local_72c;
  __m128i *local_728;
  undefined1 (*local_720) [16];
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  longlong local_5d8;
  ulong uStack_5d0;
  longlong local_5c8;
  undefined8 uStack_5c0;
  longlong local_5b8;
  ulong uStack_5b0;
  longlong local_5a8;
  undefined8 uStack_5a0;
  longlong local_598;
  ulong uStack_590;
  longlong local_588;
  undefined8 uStack_580;
  longlong local_578;
  ulong uStack_570;
  longlong local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  ulong uStack_550;
  undefined8 local_548;
  ulong uStack_540;
  undefined8 local_538;
  ulong uStack_530;
  undefined8 local_528;
  ulong uStack_520;
  undefined8 local_518;
  ulong uStack_510;
  undefined8 local_508;
  ulong uStack_500;
  undefined8 local_4f8;
  ulong uStack_4f0;
  undefined8 local_4e8;
  ulong uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  ulong uStack_4b0;
  undefined8 local_4a8;
  ulong uStack_4a0;
  undefined8 local_498;
  ulong uStack_490;
  undefined8 local_488;
  ulong uStack_480;
  undefined8 local_478;
  ulong uStack_470;
  undefined8 local_468;
  ulong uStack_460;
  undefined8 local_458;
  ulong uStack_450;
  undefined8 local_448;
  ulong uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  int local_428;
  int local_424;
  int32_t local_420;
  int32_t local_41c;
  int32_t local_418;
  int32_t local_414;
  undefined4 local_410;
  uint local_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  int32_t local_2b8;
  int32_t local_2b4;
  int32_t local_2b0;
  int32_t local_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  int32_t local_298;
  int32_t local_294;
  int32_t local_290;
  int32_t local_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  int32_t local_278;
  int32_t local_274;
  int32_t local_270;
  int32_t local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  int32_t local_258;
  int32_t local_254;
  int32_t local_250;
  int32_t local_24c;
  longlong local_248;
  longlong lStack_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  longlong local_228;
  longlong lStack_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  ulong uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  ulong uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  ulong uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  ulong uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  ulong uStack_100;
  long local_f8;
  long lStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  long local_d8;
  long lStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  long local_b8;
  long lStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  long local_98;
  long lStack_90;
  ulong local_88;
  ulong uStack_80;
  long local_78;
  long lStack_70;
  ulong local_68;
  ulong uStack_60;
  long local_58;
  long lStack_50;
  ulong local_48;
  ulong uStack_40;
  long local_38;
  long lStack_30;
  ulong local_28;
  ulong uStack_20;
  long local_18;
  long lStack_10;
  
  local_738 = in_R9D;
  local_734 = in_R8D;
  local_730 = in_ECX;
  local_72c = in_EDX;
  local_728 = in_RSI;
  local_720 = in_RDI;
  local_740 = sinpi_arr(in_EDX);
  local_438 = 0;
  uStack_430 = 0;
  local_758 = 0;
  uStack_750 = 0;
  local_40c = 1 << ((char)local_72c + 3U & 0x1f);
  local_4c8 = CONCAT44(local_40c,local_40c);
  uStack_4c0 = CONCAT44(local_40c,local_40c);
  local_4d8 = 0;
  uStack_4d0 = 0;
  local_768 = (ulong)local_40c;
  uStack_760 = (ulong)local_40c;
  local_410 = 0x10;
  local_2cc = 0x10;
  local_2d0 = 0x10;
  local_2d4 = 0x10;
  local_2d8 = 0x10;
  local_778 = 0x1000000010;
  uStack_770 = 0x1000000010;
  local_414 = local_740[1];
  local_788 = CONCAT44(local_414,local_414);
  uStack_780 = CONCAT44(local_414,local_414);
  local_418 = local_740[2];
  local_798 = CONCAT44(local_418,local_418);
  uStack_790 = CONCAT44(local_418,local_418);
  local_41c = local_740[3];
  local_7a8 = CONCAT44(local_41c,local_41c);
  uStack_7a0 = CONCAT44(local_41c,local_41c);
  local_420 = local_740[4];
  local_7b8 = CONCAT44(local_420,local_420);
  uStack_7b0 = CONCAT44(local_420,local_420);
  local_858 = *(undefined8 *)*local_720;
  uStack_850 = *(undefined8 *)(*local_720 + 8);
  local_868 = *(undefined8 *)local_720[1];
  uStack_860 = *(undefined8 *)(local_720[1] + 8);
  pauVar1 = local_720 + 2;
  local_878 = *(undefined8 *)*pauVar1;
  uStack_870 = *(undefined8 *)(local_720[2] + 8);
  pauVar2 = local_720 + 3;
  local_888 = *(undefined8 *)*pauVar2;
  uStack_880 = *(undefined8 *)(local_720[3] + 8);
  auVar58._8_8_ = uStack_780;
  auVar58._0_8_ = local_788;
  auVar53 = pmulld(*local_720,auVar58);
  auVar57._8_8_ = uStack_790;
  auVar57._0_8_ = local_798;
  auVar54 = pmulld(*local_720,auVar57);
  auVar55._8_8_ = uStack_7a0;
  auVar55._0_8_ = local_7a8;
  auVar55 = pmulld(local_720[1],auVar55);
  auVar56._8_8_ = uStack_7b0;
  auVar56._0_8_ = local_7b8;
  auVar56 = pmulld(*pauVar1,auVar56);
  auVar5._8_8_ = uStack_780;
  auVar5._0_8_ = local_788;
  local_818 = pmulld(*pauVar1,auVar5);
  auVar4._8_8_ = uStack_790;
  auVar4._0_8_ = local_798;
  local_828 = pmulld(*pauVar2,auVar4);
  auVar3._8_8_ = uStack_7b0;
  auVar3._0_8_ = local_7b8;
  local_838 = pmulld(*pauVar2,auVar3);
  local_5e8._0_4_ = (int)local_858;
  local_5e8._4_4_ = (int)((ulong)local_858 >> 0x20);
  uStack_5e0._0_4_ = (int)uStack_850;
  uStack_5e0._4_4_ = (int)((ulong)uStack_850 >> 0x20);
  local_5f8._0_4_ = (int)local_878;
  local_5f8._4_4_ = (int)((ulong)local_878 >> 0x20);
  uStack_5f0._0_4_ = (int)uStack_870;
  uStack_5f0._4_4_ = (int)((ulong)uStack_870 >> 0x20);
  local_668 = CONCAT44(local_5e8._4_4_ - local_5f8._4_4_,(int)local_5e8 - (int)local_5f8);
  uStack_660 = CONCAT44(uStack_5e0._4_4_ - uStack_5f0._4_4_,(int)uStack_5e0 - (int)uStack_5f0);
  local_678._0_4_ = (int)local_888;
  local_678._4_4_ = (int)((ulong)local_888 >> 0x20);
  uStack_670._0_4_ = (int)uStack_880;
  uStack_670._4_4_ = (int)((ulong)uStack_880 >> 0x20);
  local_848 = ((int)local_5e8 - (int)local_5f8) + (int)local_678;
  iStack_844 = (local_5e8._4_4_ - local_5f8._4_4_) + local_678._4_4_;
  iStack_840 = ((int)uStack_5e0 - (int)uStack_5f0) + (int)uStack_670;
  iStack_83c = (uStack_5e0._4_4_ - uStack_5f0._4_4_) + uStack_670._4_4_;
  local_7d8 = auVar53._0_8_;
  uStack_7d0 = auVar53._8_8_;
  local_808._0_8_ = auVar56._0_8_;
  local_808._8_8_ = auVar56._8_8_;
  local_688 = local_7d8;
  uVar29 = local_688;
  uStack_680 = uStack_7d0;
  uVar30 = uStack_680;
  local_698 = local_808._0_8_;
  uVar27 = local_698;
  uStack_690 = local_808._8_8_;
  uVar28 = uStack_690;
  local_688._0_4_ = auVar53._0_4_;
  local_688._4_4_ = auVar53._4_4_;
  uStack_680._0_4_ = auVar53._8_4_;
  uStack_680._4_4_ = auVar53._12_4_;
  local_698._0_4_ = auVar56._0_4_;
  local_698._4_4_ = auVar56._4_4_;
  uStack_690._0_4_ = auVar56._8_4_;
  uStack_690._4_4_ = auVar56._12_4_;
  local_6a8 = CONCAT44(local_688._4_4_ + local_698._4_4_,(int)local_688 + (int)local_698);
  uStack_6a0 = CONCAT44(uStack_680._4_4_ + uStack_690._4_4_,(int)uStack_680 + (int)uStack_690);
  local_6b8 = local_828._0_8_;
  uVar25 = local_6b8;
  uStack_6b0 = local_828._8_8_;
  uVar26 = uStack_6b0;
  local_6b8._0_4_ = local_828._0_4_;
  local_6b8._4_4_ = local_828._4_4_;
  uStack_6b0._0_4_ = local_828._8_4_;
  uStack_6b0._4_4_ = local_828._12_4_;
  local_6b8._0_4_ = (int)local_688 + (int)local_698 + (int)local_6b8;
  local_6b8._4_4_ = local_688._4_4_ + local_698._4_4_ + local_6b8._4_4_;
  uStack_6b0._0_4_ = (int)uStack_680 + (int)uStack_690 + (int)uStack_6b0;
  uStack_6b0._4_4_ = uStack_680._4_4_ + uStack_690._4_4_ + uStack_6b0._4_4_;
  local_7d8 = CONCAT44(local_6b8._4_4_,(int)local_6b8);
  uStack_7d0._0_4_ = (int)uStack_6b0;
  uStack_7d0._4_4_ = uStack_6b0._4_4_;
  local_7e8 = auVar54._0_8_;
  uStack_7e0 = auVar54._8_8_;
  local_608 = local_7e8;
  uVar35 = local_608;
  uStack_600 = uStack_7e0;
  uVar36 = uStack_600;
  local_618 = local_818._0_8_;
  uVar33 = local_618;
  uStack_610 = local_818._8_8_;
  uVar34 = uStack_610;
  local_608._0_4_ = auVar54._0_4_;
  local_608._4_4_ = auVar54._4_4_;
  uStack_600._0_4_ = auVar54._8_4_;
  uStack_600._4_4_ = auVar54._12_4_;
  local_618._0_4_ = local_818._0_4_;
  local_618._4_4_ = local_818._4_4_;
  uStack_610._0_4_ = local_818._8_4_;
  uStack_610._4_4_ = local_818._12_4_;
  local_628 = CONCAT44(local_608._4_4_ - local_618._4_4_,(int)local_608 - (int)local_618);
  uStack_620 = CONCAT44(uStack_600._4_4_ - uStack_610._4_4_,(int)uStack_600 - (int)uStack_610);
  local_638 = local_838._0_8_;
  uVar31 = local_638;
  uStack_630 = local_838._8_8_;
  uVar32 = uStack_630;
  local_638._0_4_ = local_838._0_4_;
  local_638._4_4_ = local_838._4_4_;
  uStack_630._0_4_ = local_838._8_4_;
  uStack_630._4_4_ = local_838._12_4_;
  local_638._0_4_ = ((int)local_608 - (int)local_618) - (int)local_638;
  local_638._4_4_ = (local_608._4_4_ - local_618._4_4_) - local_638._4_4_;
  uStack_630._0_4_ = ((int)uStack_600 - (int)uStack_610) - (int)uStack_630;
  uStack_630._4_4_ = (uStack_600._4_4_ - uStack_610._4_4_) - uStack_630._4_4_;
  local_7e8 = CONCAT44(local_638._4_4_,(int)local_638);
  uStack_7e0._0_4_ = (int)uStack_630;
  uStack_7e0._4_4_ = uStack_630._4_4_;
  local_7f8._0_8_ = auVar55._0_8_;
  local_658 = local_7f8._0_8_;
  local_7f8._8_8_ = auVar55._8_8_;
  uStack_650 = local_7f8._8_8_;
  local_3f8 = CONCAT44(iStack_844,local_848);
  uStack_3f0 = CONCAT44(iStack_83c,iStack_840);
  auVar54._8_8_ = uStack_3f0;
  auVar54._0_8_ = local_3f8;
  auVar53._8_8_ = uStack_7a0;
  auVar53._0_8_ = local_7a8;
  auVar56 = pmulld(auVar54,auVar53);
  local_6c8 = local_7d8;
  uStack_6c0 = uStack_7d0;
  local_6d8 = local_7f8._0_8_;
  uVar23 = local_6d8;
  uStack_6d0 = local_7f8._8_8_;
  uVar24 = uStack_6d0;
  local_6d8._0_4_ = auVar55._0_4_;
  local_6d8._4_4_ = auVar55._4_4_;
  uStack_6d0._0_4_ = auVar55._8_4_;
  uStack_6d0._4_4_ = auVar55._12_4_;
  uVar65 = uStack_6b0._4_4_ + uStack_6d0._4_4_;
  local_898 = CONCAT44(local_6b8._4_4_ + local_6d8._4_4_,(int)local_6b8 + (int)local_6d8);
  uStack_890._0_4_ = (int)uStack_6b0 + (int)uStack_6d0;
  auVar22 = _local_898;
  uStack_890._4_4_ = uVar65;
  local_6e8 = local_7e8;
  uStack_6e0 = uStack_7e0;
  local_6f8 = local_7f8._0_8_;
  uStack_6f0 = local_7f8._8_8_;
  uVar66 = uStack_630._4_4_ + uStack_6d0._4_4_;
  local_8a8 = CONCAT44(local_638._4_4_ + local_6d8._4_4_,(int)local_638 + (int)local_6d8);
  uStack_8a0._0_4_ = (int)uStack_630 + (int)uStack_6d0;
  auVar21 = _local_8a8;
  uStack_8a0._4_4_ = uVar66;
  local_7f8._0_8_ = auVar56._0_8_;
  local_7f8._8_8_ = auVar56._8_8_;
  local_708 = local_7d8;
  uStack_700 = uStack_7d0;
  local_718 = local_7e8;
  uStack_710 = uStack_7e0;
  local_7c8 = (int)local_6b8 + (int)local_638;
  iStack_7c4 = local_6b8._4_4_ + local_638._4_4_;
  iStack_7c0 = (int)uStack_6b0 + (int)uStack_630;
  iStack_7bc = uStack_6b0._4_4_ + uStack_630._4_4_;
  local_648 = CONCAT44(iStack_7c4,local_7c8);
  uStack_640 = CONCAT44(iStack_7bc,iStack_7c0);
  uVar67 = iStack_7bc - uStack_6d0._4_4_;
  local_8c8 = CONCAT44(iStack_7c4 - local_6d8._4_4_,local_7c8 - (int)local_6d8);
  uStack_8c0._0_4_ = iStack_7c0 - (int)uStack_6d0;
  auVar20 = _local_8c8;
  uStack_8c0._4_4_ = uVar67;
  local_118 = local_898;
  uStack_110 = uStack_890;
  auVar18._8_8_ = uStack_890;
  auVar18._0_8_ = local_898;
  auVar17._8_8_ = 0x1000000010;
  auVar17._0_8_ = 0x1000000010;
  auVar53 = pmuldq(auVar18,auVar17);
  local_8d8._0_8_ = auVar53._0_8_;
  local_8d8._8_8_ = auVar53._8_8_;
  local_18 = local_8d8._0_8_;
  lStack_10 = local_8d8._8_8_;
  local_28 = local_768;
  uStack_20 = uStack_760;
  lVar51 = local_8d8._0_8_ + local_768;
  uVar61 = local_8d8._8_8_ + uStack_760;
  local_8d8._8_8_ = uVar61;
  local_8d8._0_8_ = lVar51;
  auVar54 = local_8d8;
  local_898 = auVar22._4_8_;
  uStack_890 = (ulong)uVar65;
  local_138 = local_898;
  uStack_130 = uStack_890;
  auVar16._8_4_ = uVar65;
  auVar16._0_8_ = local_898;
  auVar16._12_4_ = 0;
  auVar15._8_8_ = 0x1000000010;
  auVar15._0_8_ = 0x1000000010;
  auVar53 = pmuldq(auVar16,auVar15);
  local_918._0_8_ = auVar53._0_8_;
  local_918._8_8_ = auVar53._8_8_;
  local_38 = local_918._0_8_;
  lStack_30 = local_918._8_8_;
  local_48 = local_768;
  uStack_40 = uStack_760;
  lVar52 = local_918._0_8_ + local_768;
  uVar62 = local_918._8_8_ + uStack_760;
  local_918._8_8_ = uVar62;
  local_918._0_8_ = lVar52;
  auVar53 = local_918;
  auVar57 = local_8d8 >> 0x10;
  local_8d8._0_8_ = local_8d8._2_8_;
  local_8d8._8_8_ = uVar61 >> 0x10;
  local_918._0_8_ = local_918._2_8_;
  local_918._8_8_ = uVar62 >> 0x10;
  local_4e8 = local_8d8._0_8_;
  uVar44 = local_4e8;
  uStack_4e0 = local_8d8._8_8_;
  local_4f8 = local_918._0_8_;
  uVar43 = local_4f8;
  uStack_4f0 = local_918._8_8_;
  local_4e8._0_4_ = (undefined4)((ulong)lVar51 >> 0x10);
  local_4e8._4_4_ = auVar54._6_4_;
  local_4f8._0_4_ = (undefined4)((ulong)lVar52 >> 0x10);
  local_4f8._4_4_ = auVar53._6_4_;
  local_898 = CONCAT44((undefined4)local_4f8,(undefined4)local_4e8);
  uStack_890._0_4_ = local_4e8._4_4_;
  uStack_890._4_4_ = local_4f8._4_4_;
  local_448 = local_8d8._0_8_;
  uStack_440 = local_8d8._8_8_;
  uVar50 = uStack_440;
  local_458 = local_918._0_8_;
  uStack_450 = local_918._8_8_;
  uVar49 = uStack_450;
  uStack_440._0_4_ = (undefined4)(uVar61 >> 0x10);
  uStack_450._0_4_ = (undefined4)(uVar62 >> 0x10);
  local_918._4_4_ = (undefined4)uStack_450;
  local_918._0_4_ = (undefined4)uStack_440;
  local_918._8_2_ = (short)(uVar61 >> 0x30);
  local_918._10_2_ = 0;
  local_918._12_2_ = (short)(uVar62 >> 0x30);
  local_918._14_2_ = 0;
  auVar4 = local_918;
  local_918._14_2_ = 0;
  local_918._8_6_ = local_918._8_6_;
  local_568 = local_898;
  uStack_560 = uStack_890;
  local_578 = local_918._0_8_;
  uStack_570 = local_918._8_8_;
  uStack_890 = local_918._0_8_;
  local_158 = local_8a8;
  uStack_150 = uStack_8a0;
  auVar14._8_8_ = uStack_8a0;
  auVar14._0_8_ = local_8a8;
  auVar13._8_8_ = 0x1000000010;
  auVar13._0_8_ = 0x1000000010;
  auVar53 = pmuldq(auVar14,auVar13);
  local_8e8._0_8_ = auVar53._0_8_;
  local_8e8._8_8_ = auVar53._8_8_;
  local_58 = local_8e8._0_8_;
  lStack_50 = local_8e8._8_8_;
  local_68 = local_768;
  uStack_60 = uStack_760;
  lVar51 = local_8e8._0_8_ + local_768;
  uVar61 = local_8e8._8_8_ + uStack_760;
  local_8e8._8_8_ = uVar61;
  local_8e8._0_8_ = lVar51;
  auVar54 = local_8e8;
  local_8a8 = auVar21._4_8_;
  uStack_8a0 = (ulong)uVar66;
  local_178 = local_8a8;
  uStack_170 = uStack_8a0;
  auVar12._8_4_ = uVar66;
  auVar12._0_8_ = local_8a8;
  auVar12._12_4_ = 0;
  auVar11._8_8_ = 0x1000000010;
  auVar11._0_8_ = 0x1000000010;
  auVar53 = pmuldq(auVar12,auVar11);
  local_928._0_8_ = auVar53._0_8_;
  local_928._8_8_ = auVar53._8_8_;
  local_78 = local_928._0_8_;
  lStack_70 = local_928._8_8_;
  local_88 = local_768;
  uStack_80 = uStack_760;
  lVar52 = local_928._0_8_ + local_768;
  uVar62 = local_928._8_8_ + uStack_760;
  local_928._8_8_ = uVar62;
  local_928._0_8_ = lVar52;
  auVar53 = local_928;
  auVar58 = local_8e8 >> 0x10;
  local_8e8._0_8_ = local_8e8._2_8_;
  local_8e8._8_8_ = uVar61 >> 0x10;
  local_928._0_8_ = local_928._2_8_;
  local_928._8_8_ = uVar62 >> 0x10;
  local_508 = local_8e8._0_8_;
  uVar42 = local_508;
  uStack_500 = local_8e8._8_8_;
  local_518 = local_928._0_8_;
  uVar41 = local_518;
  uStack_510 = local_928._8_8_;
  local_508._0_4_ = (undefined4)((ulong)lVar51 >> 0x10);
  local_508._4_4_ = auVar54._6_4_;
  local_518._0_4_ = (undefined4)((ulong)lVar52 >> 0x10);
  local_518._4_4_ = auVar53._6_4_;
  local_8a8 = CONCAT44((undefined4)local_518,(undefined4)local_508);
  uStack_8a0._0_4_ = local_508._4_4_;
  uStack_8a0._4_4_ = local_518._4_4_;
  local_468 = local_8e8._0_8_;
  uStack_460 = local_8e8._8_8_;
  uVar48 = uStack_460;
  local_478 = local_928._0_8_;
  uStack_470 = local_928._8_8_;
  uVar47 = uStack_470;
  uStack_460._0_4_ = (undefined4)(uVar61 >> 0x10);
  uStack_470._0_4_ = (undefined4)(uVar62 >> 0x10);
  local_928._4_4_ = (undefined4)uStack_470;
  local_928._0_4_ = (undefined4)uStack_460;
  local_928._8_2_ = (short)(uVar61 >> 0x30);
  local_928._10_2_ = 0;
  local_928._12_2_ = (short)(uVar62 >> 0x30);
  local_928._14_2_ = 0;
  auVar3 = local_928;
  local_928._14_2_ = 0;
  local_928._8_6_ = local_928._8_6_;
  local_588 = local_8a8;
  uStack_580 = uStack_8a0;
  local_598 = local_928._0_8_;
  uStack_590 = local_928._8_8_;
  uStack_8a0 = local_928._0_8_;
  local_198 = local_7f8._0_8_;
  uStack_190 = local_7f8._8_8_;
  auVar10._8_8_ = 0x1000000010;
  auVar10._0_8_ = 0x1000000010;
  auVar53 = pmuldq(auVar56,auVar10);
  local_8f8._0_8_ = auVar53._0_8_;
  local_8f8._8_8_ = auVar53._8_8_;
  local_98 = local_8f8._0_8_;
  lStack_90 = local_8f8._8_8_;
  local_a8 = local_768;
  uStack_a0 = uStack_760;
  lVar51 = local_8f8._0_8_ + local_768;
  uVar61 = local_8f8._8_8_ + uStack_760;
  local_8f8._8_8_ = uVar61;
  local_8f8._0_8_ = lVar51;
  auVar54 = local_8f8;
  local_8b8 = auVar56._4_8_;
  uStack_8b0 = (ulong)auVar56._12_4_;
  local_1b8 = local_8b8;
  uStack_1b0 = uStack_8b0;
  auVar9._12_4_ = 0;
  auVar9._0_12_ = auVar56._4_12_;
  auVar59._8_8_ = 0x1000000010;
  auVar59._0_8_ = 0x1000000010;
  auVar53 = pmuldq(auVar9,auVar59);
  local_938._0_8_ = auVar53._0_8_;
  local_938._8_8_ = auVar53._8_8_;
  local_b8 = local_938._0_8_;
  lStack_b0 = local_938._8_8_;
  local_c8 = local_768;
  uStack_c0 = uStack_760;
  lVar52 = local_938._0_8_ + local_768;
  uVar62 = local_938._8_8_ + uStack_760;
  local_938._8_8_ = uVar62;
  local_938._0_8_ = lVar52;
  auVar53 = local_938;
  auVar59 = local_8f8 >> 0x10;
  local_8f8._0_8_ = local_8f8._2_8_;
  local_8f8._8_8_ = uVar61 >> 0x10;
  local_938._0_8_ = local_938._2_8_;
  local_938._8_8_ = uVar62 >> 0x10;
  local_528 = local_8f8._0_8_;
  uVar40 = local_528;
  uStack_520 = local_8f8._8_8_;
  local_538 = local_938._0_8_;
  uVar39 = local_538;
  uStack_530 = local_938._8_8_;
  local_528._0_4_ = (undefined4)((ulong)lVar51 >> 0x10);
  local_528._4_4_ = auVar54._6_4_;
  local_538._0_4_ = (undefined4)((ulong)lVar52 >> 0x10);
  local_538._4_4_ = auVar53._6_4_;
  local_8b8 = CONCAT44((undefined4)local_538,(undefined4)local_528);
  uStack_8b0._0_4_ = local_528._4_4_;
  uStack_8b0._4_4_ = local_538._4_4_;
  local_488 = local_8f8._0_8_;
  uStack_480 = local_8f8._8_8_;
  uVar46 = uStack_480;
  local_498 = local_938._0_8_;
  uStack_490 = local_938._8_8_;
  uVar45 = uStack_490;
  uStack_480._0_4_ = (undefined4)(uVar61 >> 0x10);
  uStack_490._0_4_ = (undefined4)(uVar62 >> 0x10);
  local_938._4_4_ = (undefined4)uStack_490;
  local_938._0_4_ = (undefined4)uStack_480;
  local_938._8_2_ = (short)(uVar61 >> 0x30);
  local_938._10_2_ = 0;
  local_938._12_2_ = (short)(uVar62 >> 0x30);
  local_938._14_2_ = 0;
  auVar54 = local_938;
  local_938._14_2_ = 0;
  local_938._8_6_ = local_938._8_6_;
  local_5a8 = local_8b8;
  uStack_5a0 = uStack_8b0;
  local_5b8 = local_938._0_8_;
  uStack_5b0 = local_938._8_8_;
  uStack_8b0 = local_938._0_8_;
  local_1d8 = local_8c8;
  uStack_1d0 = uStack_8c0;
  auVar8._8_8_ = uStack_8c0;
  auVar8._0_8_ = local_8c8;
  auVar7._8_8_ = 0x1000000010;
  auVar7._0_8_ = 0x1000000010;
  auVar53 = pmuldq(auVar8,auVar7);
  local_908._0_8_ = auVar53._0_8_;
  local_908._8_8_ = auVar53._8_8_;
  local_d8 = local_908._0_8_;
  lStack_d0 = local_908._8_8_;
  local_e8 = local_768;
  uStack_e0 = uStack_760;
  lVar51 = local_908._0_8_ + local_768;
  uVar63 = local_908._8_8_ + uStack_760;
  local_908._8_8_ = uVar63;
  local_908._0_8_ = lVar51;
  auVar5 = local_908;
  local_8c8 = auVar20._4_8_;
  uStack_8c0 = (ulong)uVar67;
  local_1f8 = local_8c8;
  uStack_1f0 = uStack_8c0;
  auVar6._8_4_ = uVar67;
  auVar6._0_8_ = local_8c8;
  auVar6._12_4_ = 0;
  auVar60._8_8_ = 0x1000000010;
  auVar60._0_8_ = 0x1000000010;
  auVar53 = pmuldq(auVar6,auVar60);
  local_948._0_8_ = auVar53._0_8_;
  local_948._8_8_ = auVar53._8_8_;
  local_f8 = local_948._0_8_;
  lStack_f0 = local_948._8_8_;
  local_108 = local_768;
  uStack_100 = uStack_760;
  lVar52 = local_948._0_8_ + local_768;
  uVar64 = local_948._8_8_ + uStack_760;
  local_948._8_8_ = uVar64;
  local_948._0_8_ = lVar52;
  auVar53 = local_948;
  auVar60 = local_908 >> 0x10;
  local_908._0_8_ = local_908._2_8_;
  local_908._8_8_ = uVar63 >> 0x10;
  local_948._0_8_ = local_948._2_8_;
  local_948._8_8_ = uVar64 >> 0x10;
  local_548 = local_908._0_8_;
  uVar38 = local_548;
  uStack_540 = local_908._8_8_;
  local_558 = local_948._0_8_;
  uVar37 = local_558;
  uStack_550 = local_948._8_8_;
  local_548._0_4_ = (undefined4)((ulong)lVar51 >> 0x10);
  local_548._4_4_ = auVar5._6_4_;
  local_558._0_4_ = (undefined4)((ulong)lVar52 >> 0x10);
  local_558._4_4_ = auVar53._6_4_;
  local_8c8 = CONCAT44((undefined4)local_558,(undefined4)local_548);
  uStack_8c0._0_4_ = local_548._4_4_;
  uStack_8c0._4_4_ = local_558._4_4_;
  local_4a8 = local_908._0_8_;
  uStack_4a0 = local_908._8_8_;
  uVar62 = uStack_4a0;
  local_4b8 = local_948._0_8_;
  uStack_4b0 = local_948._8_8_;
  uVar61 = uStack_4b0;
  uStack_4a0._0_4_ = (undefined4)(uVar63 >> 0x10);
  uStack_4b0._0_4_ = (undefined4)(uVar64 >> 0x10);
  local_948._4_4_ = (undefined4)uStack_4b0;
  local_948._0_4_ = (undefined4)uStack_4a0;
  local_948._8_2_ = (short)(uVar63 >> 0x30);
  local_948._10_2_ = 0;
  local_948._12_2_ = (short)(uVar64 >> 0x30);
  local_948._14_2_ = 0;
  auVar53 = local_948;
  local_948._14_2_ = 0;
  local_948._8_6_ = local_948._8_6_;
  local_5c8 = local_8c8;
  uStack_5c0 = uStack_8c0;
  local_5d8 = local_948._0_8_;
  uStack_5d0 = local_948._8_8_;
  uStack_8c0 = local_948._0_8_;
  (*local_728)[0] = local_898;
  (*local_728)[1] = local_918._0_8_;
  local_728[1][0] = local_8a8;
  local_728[1][1] = local_928._0_8_;
  local_728[2][0] = local_8b8;
  local_728[2][1] = local_938._0_8_;
  local_728[3][0] = local_8c8;
  local_728[3][1] = local_948._0_8_;
  if (local_730 == 0) {
    if (local_734 + 6 < 0x10) {
      local_97c = 0x10;
    }
    else {
      local_97c = local_734 + 6;
    }
    local_94c = local_97c;
    iVar19 = local_94c;
    local_94c._0_1_ = (char)local_97c;
    local_424 = -(1 << ((char)local_94c - 1U & 0x1f));
    local_968 = CONCAT44(local_424,local_424);
    lStack_960 = CONCAT44(local_424,local_424);
    local_428 = (1 << ((char)local_94c - 1U & 0x1f)) + -1;
    local_978 = CONCAT44(local_428,local_428);
    lStack_970 = CONCAT44(local_428,local_428);
    local_94c = iVar19;
    local_948 = auVar53;
    local_938 = auVar54;
    local_928 = auVar3;
    local_918 = auVar4;
    local_908 = auVar60;
    local_8f8 = auVar59;
    local_8e8 = auVar58;
    local_8d8 = auVar57;
    local_808 = auVar55;
    local_7f8 = auVar56;
    local_6d8 = uVar23;
    uStack_6d0 = uVar24;
    local_6b8 = uVar25;
    uStack_6b0 = uVar26;
    local_698 = uVar27;
    uStack_690 = uVar28;
    local_688 = uVar29;
    uStack_680 = uVar30;
    local_678 = local_888;
    uStack_670 = uStack_880;
    local_638 = uVar31;
    uStack_630 = uVar32;
    local_618 = uVar33;
    uStack_610 = uVar34;
    local_608 = uVar35;
    uStack_600 = uVar36;
    local_5f8 = local_878;
    uStack_5f0 = uStack_870;
    local_5e8 = local_858;
    uStack_5e0 = uStack_850;
    local_558 = uVar37;
    local_548 = uVar38;
    local_538 = uVar39;
    local_528 = uVar40;
    local_518 = uVar41;
    local_508 = uVar42;
    local_4f8 = uVar43;
    local_4e8 = uVar44;
    uStack_4b0 = uVar61;
    uStack_4a0 = uVar62;
    uStack_490 = uVar45;
    uStack_480 = uVar46;
    uStack_470 = uVar47;
    uStack_460 = uVar48;
    uStack_450 = uVar49;
    uStack_440 = uVar50;
    local_408 = local_7a8;
    uStack_400 = uStack_7a0;
    local_3e8 = local_7b8;
    uStack_3e0 = uStack_7b0;
    local_3d8 = local_888;
    uStack_3d0 = uStack_880;
    local_3c8 = local_798;
    uStack_3c0 = uStack_790;
    local_3b8 = local_888;
    uStack_3b0 = uStack_880;
    local_3a8 = local_788;
    uStack_3a0 = uStack_780;
    local_398 = local_878;
    uStack_390 = uStack_870;
    local_388 = local_7b8;
    uStack_380 = uStack_7b0;
    local_378 = local_878;
    uStack_370 = uStack_870;
    local_368 = local_7a8;
    uStack_360 = uStack_7a0;
    local_358 = local_868;
    uStack_350 = uStack_860;
    local_348 = local_798;
    uStack_340 = uStack_790;
    local_338 = local_858;
    uStack_330 = uStack_850;
    local_328 = local_788;
    uStack_320 = uStack_780;
    local_318 = local_858;
    uStack_310 = uStack_850;
    local_308 = local_4c8;
    uStack_300 = uStack_4c0;
    local_2f8 = local_40c;
    local_2f4 = local_40c;
    local_2f0 = local_40c;
    local_2ec = local_40c;
    local_2e8 = local_778;
    uStack_2e0 = uStack_770;
    local_2c8 = local_788;
    uStack_2c0 = uStack_780;
    local_2b8 = local_414;
    local_2b4 = local_414;
    local_2b0 = local_414;
    local_2ac = local_414;
    local_2a8 = local_798;
    uStack_2a0 = uStack_790;
    local_298 = local_418;
    local_294 = local_418;
    local_290 = local_418;
    local_28c = local_418;
    local_288 = local_7a8;
    uStack_280 = uStack_7a0;
    local_278 = local_41c;
    local_274 = local_41c;
    local_270 = local_41c;
    local_26c = local_41c;
    local_268 = local_7b8;
    uStack_260 = uStack_7b0;
    local_258 = local_420;
    local_254 = local_420;
    local_250 = local_420;
    local_24c = local_420;
    local_248 = local_968;
    lStack_240 = lStack_960;
    local_238 = local_424;
    local_234 = local_424;
    local_230 = local_424;
    local_22c = local_424;
    local_228 = local_978;
    lStack_220 = lStack_970;
    local_218 = local_428;
    local_214 = local_428;
    local_210 = local_428;
    local_20c = local_428;
    local_208 = local_778;
    uStack_200 = uStack_770;
    local_1e8 = local_778;
    uStack_1e0 = uStack_770;
    local_1c8 = local_778;
    uStack_1c0 = uStack_770;
    local_1a8 = local_778;
    uStack_1a0 = uStack_770;
    local_188 = local_778;
    uStack_180 = uStack_770;
    local_168 = local_778;
    uStack_160 = uStack_770;
    local_148 = local_778;
    uStack_140 = uStack_770;
    local_128 = local_778;
    uStack_120 = uStack_770;
    round_shift_4x4(local_728,local_738);
    highbd_clamp_epi32_sse4_1(local_728,local_728,(__m128i *)&local_968,(__m128i *)&local_978,4);
  }
  return;
}

Assistant:

static void iadst4x4_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                            int bd, int out_shift) {
  const int32_t *sinpi = sinpi_arr(bit);
  const __m128i zero = _mm_setzero_si128();
  __m128i rnding = _mm_set1_epi32(1 << (bit + 4 - 1));
  rnding = _mm_unpacklo_epi32(rnding, zero);
  const __m128i mul = _mm_set1_epi32(1 << 4);
  const __m128i sinpi1 = _mm_set1_epi32((int)sinpi[1]);
  const __m128i sinpi2 = _mm_set1_epi32((int)sinpi[2]);
  const __m128i sinpi3 = _mm_set1_epi32((int)sinpi[3]);
  const __m128i sinpi4 = _mm_set1_epi32((int)sinpi[4]);
  __m128i t;
  __m128i s0, s1, s2, s3, s4, s5, s6, s7;
  __m128i x0, x1, x2, x3;
  __m128i u0, u1, u2, u3;
  __m128i u0_low, u1_low, u2_low, u3_low;
  __m128i u0_high, u1_high, u2_high, u3_high;

  x0 = in[0];
  x1 = in[1];
  x2 = in[2];
  x3 = in[3];

  s0 = _mm_mullo_epi32(x0, sinpi1);
  s1 = _mm_mullo_epi32(x0, sinpi2);
  s2 = _mm_mullo_epi32(x1, sinpi3);
  s3 = _mm_mullo_epi32(x2, sinpi4);
  s4 = _mm_mullo_epi32(x2, sinpi1);
  s5 = _mm_mullo_epi32(x3, sinpi2);
  s6 = _mm_mullo_epi32(x3, sinpi4);
  t = _mm_sub_epi32(x0, x2);
  s7 = _mm_add_epi32(t, x3);

  t = _mm_add_epi32(s0, s3);
  s0 = _mm_add_epi32(t, s5);
  t = _mm_sub_epi32(s1, s4);
  s1 = _mm_sub_epi32(t, s6);
  s3 = s2;
  s2 = _mm_mullo_epi32(s7, sinpi3);

  u0 = _mm_add_epi32(s0, s3);
  u1 = _mm_add_epi32(s1, s3);
  u2 = s2;
  t = _mm_add_epi32(s0, s1);
  u3 = _mm_sub_epi32(t, s3);

  // u0
  u0_low = _mm_mul_epi32(u0, mul);
  u0_low = _mm_add_epi64(u0_low, rnding);

  u0 = _mm_srli_si128(u0, 4);
  u0_high = _mm_mul_epi32(u0, mul);
  u0_high = _mm_add_epi64(u0_high, rnding);

  u0_low = _mm_srli_si128(u0_low, 2);
  u0_high = _mm_srli_si128(u0_high, 2);

  u0 = _mm_unpacklo_epi32(u0_low, u0_high);
  u0_high = _mm_unpackhi_epi32(u0_low, u0_high);
  u0 = _mm_unpacklo_epi64(u0, u0_high);

  // u1
  u1_low = _mm_mul_epi32(u1, mul);
  u1_low = _mm_add_epi64(u1_low, rnding);

  u1 = _mm_srli_si128(u1, 4);
  u1_high = _mm_mul_epi32(u1, mul);
  u1_high = _mm_add_epi64(u1_high, rnding);

  u1_low = _mm_srli_si128(u1_low, 2);
  u1_high = _mm_srli_si128(u1_high, 2);

  u1 = _mm_unpacklo_epi32(u1_low, u1_high);
  u1_high = _mm_unpackhi_epi32(u1_low, u1_high);
  u1 = _mm_unpacklo_epi64(u1, u1_high);

  // u2
  u2_low = _mm_mul_epi32(u2, mul);
  u2_low = _mm_add_epi64(u2_low, rnding);

  u2 = _mm_srli_si128(u2, 4);
  u2_high = _mm_mul_epi32(u2, mul);
  u2_high = _mm_add_epi64(u2_high, rnding);

  u2_low = _mm_srli_si128(u2_low, 2);
  u2_high = _mm_srli_si128(u2_high, 2);

  u2 = _mm_unpacklo_epi32(u2_low, u2_high);
  u2_high = _mm_unpackhi_epi32(u2_low, u2_high);
  u2 = _mm_unpacklo_epi64(u2, u2_high);

  // u3
  u3_low = _mm_mul_epi32(u3, mul);
  u3_low = _mm_add_epi64(u3_low, rnding);

  u3 = _mm_srli_si128(u3, 4);
  u3_high = _mm_mul_epi32(u3, mul);
  u3_high = _mm_add_epi64(u3_high, rnding);

  u3_low = _mm_srli_si128(u3_low, 2);
  u3_high = _mm_srli_si128(u3_high, 2);

  u3 = _mm_unpacklo_epi32(u3_low, u3_high);
  u3_high = _mm_unpackhi_epi32(u3_low, u3_high);
  u3 = _mm_unpacklo_epi64(u3, u3_high);

  out[0] = u0;
  out[1] = u1;
  out[2] = u2;
  out[3] = u3;

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_4x4(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 4);
  }
}